

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxJumpStatement::Resolve(FxJumpStatement *this,FCompileContext *ctx)

{
  EFxType EVar1;
  uint uVar2;
  FxLoopStatement *pFVar3;
  FxLoopStatement *pFVar4;
  char *pcVar5;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    pFVar3 = (FxLoopStatement *)ctx->ControlStmt;
    if (pFVar3 == (FxLoopStatement *)0x0) {
      pcVar5 = "continue";
      if (this->Token == 0x126) {
        pcVar5 = "break";
      }
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"\'%s\' outside of a loop",pcVar5);
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = (FxJumpStatement *)0x0;
    }
    else {
      pFVar4 = ctx->Loop;
      if ((pFVar3 == pFVar4) || (this->Token == 0x129)) {
        TArray<FxJumpStatement_*,_FxJumpStatement_*>::Grow(&pFVar4->Jumps,1);
        uVar2 = (pFVar4->Jumps).Count;
        (pFVar4->Jumps).Array[uVar2] = this;
        (pFVar4->Jumps).Count = uVar2 + 1;
      }
      else {
        TArray<FxJumpStatement_*,_FxJumpStatement_*>::Grow
                  ((TArray<FxJumpStatement_*,_FxJumpStatement_*> *)
                   &pFVar3[1].super_FxExpression.ValueType,1);
        EVar1 = pFVar3[1].super_FxExpression.ExprType;
        (&((pFVar3[1].super_FxExpression.ValueType)->super_PTypeBase).super_DObject._vptr_DObject)
        [EVar1] = (_func_int **)this;
        pFVar3[1].super_FxExpression.ExprType = EVar1 + EFX_Identifier;
      }
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxJumpStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();

	if (ctx.ControlStmt != nullptr)
	{
		if (ctx.ControlStmt == ctx.Loop || Token == TK_Continue)
		{
			ctx.Loop->Jumps.Push(this);
		}
		else
		{
			// break in switch.
			static_cast<FxSwitchStatement*>(ctx.ControlStmt)->Breaks.Push(this);
		}
		return this;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "'%s' outside of a loop", Token == TK_Break ? "break" : "continue");
		delete this;
		return nullptr;
	}
}